

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment_uri.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1109b::FragmentURITest_ParseRangeEnd_Test::FragmentURITest_ParseRangeEnd_Test
          (FragmentURITest_ParseRangeEnd_Test *this)

{
  FragmentURITest *in_RDI;
  
  FragmentURITest::FragmentURITest(in_RDI);
  (in_RDI->super_Test)._vptr_Test = (_func_int **)&PTR__FragmentURITest_ParseRangeEnd_Test_002170b0;
  return;
}

Assistant:

TEST_F(FragmentURITest, ParseRangeEnd) {
    EXPECT_EQ(ktx::parseFragmentURI("m=,0").mip, ktx::SelectorRange(0, 1));
    EXPECT_EQ(ktx::parseFragmentURI("a=,0").stratal, ktx::SelectorRange(0, 1));
    EXPECT_EQ(ktx::parseFragmentURI("f=,0").facial, ktx::SelectorRange(0, 1));

    EXPECT_EQ(ktx::parseFragmentURI("m=,1").mip, ktx::SelectorRange(0, 2));
    EXPECT_EQ(ktx::parseFragmentURI("a=,1").stratal, ktx::SelectorRange(0, 2));
    EXPECT_EQ(ktx::parseFragmentURI("f=,1").facial, ktx::SelectorRange(0, 2));
}